

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O3

void sbfPub_sendBuffer(sbfPub pub,sbfBuffer buffer)

{
  sbfRefCount *psVar1;
  int *piVar2;
  ulong size;
  sbfTportStream tstream;
  size_t hdrSize;
  void *pvVar3;
  void *pvVar4;
  sbfLog psVar5;
  char *pcVar6;
  undefined2 *puVar7;
  bool bVar8;
  
  if ((buffer->mRefCount).mRefCount != 1) {
LAB_00104325:
    __assert_fail("((&buffer->mRefCount)->mRefCount) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfPub.c"
                  ,0x166,"void sbfPub_sendBuffer(sbfPub, sbfBuffer)");
  }
  psVar1 = &buffer->mRefCount;
  size = buffer->mSize;
  if (0x10000 < size) {
    psVar5 = pub->mTport->mLog;
    pcVar6 = sbfTopic_getTopic(pub->mTopic);
    sbfLog_log(psVar5,3,"message size %zu too big on publisher %p (%s)",size,pub,pcVar6);
    LOCK();
    psVar1->mRefCount = psVar1->mRefCount - 1;
    UNLOCK();
    if (psVar1->mRefCount == 0) {
      if (buffer->mDestroyCb != (sbfBufferDestroyCb)0x0) {
        (*buffer->mDestroyCb)(buffer,buffer->mDestroyData,buffer->mDestroyClosure);
      }
      if (buffer->mAllocated != 0) {
LAB_00104245:
        free(buffer);
        return;
      }
      pvVar3 = buffer[-1].mOwner;
      LOCK();
      piVar2 = (int *)(*(long *)((long)pvVar3 + 0x28) + 0x1c);
      *piVar2 = *piVar2 + 1;
      UNLOCK();
      do {
        pvVar4 = *(void **)((long)pvVar3 + 0x20);
        buffer[-1].mHandlerData = pvVar4;
        LOCK();
        bVar8 = pvVar4 == *(void **)((long)pvVar3 + 0x20);
        if (bVar8) {
          *(void ***)((long)pvVar3 + 0x20) = &buffer[-1].mOwner;
        }
        UNLOCK();
      } while (!bVar8);
    }
    return;
  }
  if ((pub->mDestroyed == 0) && (pub->mReady != 0)) {
    tstream = pub->mTportStream;
    hdrSize = pub->mHeaderSize;
    if ((ulong)pub->mTport->mHandlerTable->mPacketSize < hdrSize + size) {
      sbfTport_fragment(tstream,buffer,pub->mHeader,hdrSize);
    }
    else {
      if ((sbfPub)buffer->mOwner == pub) {
        puVar7 = (undefined2 *)((long)buffer->mData - hdrSize);
        *puVar7 = (short)size;
        *(undefined1 *)(puVar7 + 2) = 1;
        if (buffer->mLocked == 0) {
          buffer->mData = puVar7;
          buffer->mSize = hdrSize + size;
          pthread_mutex_lock((pthread_mutex_t *)&tstream->mSendLock);
          (*tstream->mTport->mHandlerTable->mSendBuffer)(tstream->mStream,buffer);
          pthread_mutex_unlock((pthread_mutex_t *)&tstream->mSendLock);
          LOCK();
          psVar1->mRefCount = psVar1->mRefCount - 1;
          UNLOCK();
          if (psVar1->mRefCount != 0) {
            return;
          }
          if (buffer->mDestroyCb != (sbfBufferDestroyCb)0x0) {
            (*buffer->mDestroyCb)(buffer,buffer->mDestroyData,buffer->mDestroyClosure);
          }
          if (buffer->mAllocated == 0) {
            pvVar3 = buffer[-1].mOwner;
            LOCK();
            piVar2 = (int *)(*(long *)((long)pvVar3 + 0x28) + 0x1c);
            *piVar2 = *piVar2 + 1;
            UNLOCK();
            do {
              pvVar4 = *(void **)((long)pvVar3 + 0x20);
              buffer[-1].mHandlerData = pvVar4;
              LOCK();
              bVar8 = pvVar4 == *(void **)((long)pvVar3 + 0x20);
              if (bVar8) {
                *(void ***)((long)pvVar3 + 0x20) = &buffer[-1].mOwner;
              }
              UNLOCK();
            } while (!bVar8);
            return;
          }
          goto LAB_00104245;
        }
        sbfPub_sendBuffer_cold_1();
        goto LAB_00104325;
      }
      sbfPub_send(pub,buffer->mData,size);
    }
  }
  sbfBuffer_destroy(buffer);
  return;
}

Assistant:

void
sbfPub_sendBuffer (sbfPub pub, sbfBuffer buffer)
{
    sbfTport       tport = pub->mTport;
    sbfTportStream tstream = pub->mTportStream;
    sbfTportHeader hdr;
    size_t         size;

    SBF_ASSERT (sbfRefCount_get (&buffer->mRefCount) == 1);

    if (!sbfTport_checkMessageSize (pub, sbfBuffer_getSize (buffer)))
    {
        sbfBuffer_destroy (buffer);
        return;
    }
    if (SBF_UNLIKELY (pub->mDestroyed || !pub->mReady))
    {
        sbfBuffer_destroy (buffer);
        return;
    }

    size = sbfBuffer_getSize (buffer) + pub->mHeaderSize;
    if (SBF_UNLIKELY (size > tport->mHandlerTable->mPacketSize))
    {
        sbfTport_fragment (tstream, buffer, pub->mHeader, pub->mHeaderSize);
        sbfBuffer_destroy (buffer);
        return;
    }

    if (SBF_UNLIKELY (buffer->mOwner != pub))
    {
        sbfPub_send (pub,
                     sbfBuffer_getData (buffer),
                     sbfBuffer_getSize (buffer));
        sbfBuffer_destroy (buffer);
        return;
    }

    hdr = (void*)((char*)sbfBuffer_getData (buffer) - pub->mHeaderSize);
    hdr->mSize = sbfBuffer_getSize (buffer);
    hdr->mFlags = SBF_MESSAGE_FLAG_LAST_IN_PACKET;

    sbfBuffer_setData (buffer, hdr);
    sbfBuffer_setSize (buffer, size);

    sbfTport_sendBuffer (tstream, buffer);
    sbfBuffer_destroy (buffer);
}